

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__;
  cmCommandContext *entryPointCommand;
  iterator __position;
  bool bVar2;
  cmMakefile *this_00;
  cmMakefile *subMf;
  Snapshot newSnapshot;
  cmMakefile *local_78;
  undefined1 local_70 [16];
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> local_60;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar2) {
    entryPointCommand =
         (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
    __return_storage_ptr__ = &local_60.UpPositions;
    cmState::CreateBuildsystemDirectorySnapshot
              ((Snapshot *)__return_storage_ptr__,this->GlobalGenerator->CMakeInstance->State,
               this->StateSnapshot,&entryPointCommand->Name,entryPointCommand->Line);
    cmState::Snapshot::GetDirectory((Directory *)local_70,(Snapshot *)__return_storage_ptr__);
    cmState::Directory::SetCurrentSource((Directory *)local_70,srcPath);
    cmState::Snapshot::GetDirectory((Directory *)local_70,(Snapshot *)__return_storage_ptr__);
    cmState::Directory::SetCurrentBinary((Directory *)local_70,binPath);
    cmsys::SystemTools::MakeDirectory((binPath->_M_dataplus)._M_p);
    this_00 = (cmMakefile *)operator_new(0x730);
    cmMakefile(this_00,this->GlobalGenerator,(Snapshot *)__return_storage_ptr__);
    local_78 = this_00;
    cmGlobalGenerator::AddMakefile(this->GlobalGenerator,this_00);
    if (excludeFromAll) {
      local_70._0_8_ = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EXCLUDE_FROM_ALL","");
      SetProperty(this_00,(string *)local_70,"TRUE");
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_,
                        (ulong)((long)local_60.Data.
                                      super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    if (immediate) {
      ConfigureSubDirectory(this,this_00);
    }
    else {
      __position._M_current =
           (this->UnConfiguredDirectories).
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UnConfiguredDirectories).
          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories
                   ,__position,&local_78);
      }
      else {
        *__position._M_current = this_00;
        pppcVar1 = &(this->UnConfiguredDirectories).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot,
                                           this->ContextStack.back()->Name,
                                           this->ContextStack.back()->Line);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath.c_str());

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}